

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O3

void scroll_page_inter_command_start
               (Am_Object *command,bool vertical,Am_Object *ref_obj,int mousex,int mousey)

{
  Am_Object_Method_Type *pAVar1;
  bool bVar2;
  int iVar3;
  Am_Value *pAVar4;
  long lVar5;
  long val_1;
  long val_2;
  long target_val_1;
  long target_val_2;
  Am_Wrapper *value;
  undefined7 in_register_00000031;
  float fVar6;
  Am_Object scrollbar;
  Am_Value cur_value;
  Am_Value val2;
  Am_Object animator;
  Am_Object indicator;
  Am_Value val1;
  Am_Object scroll_command;
  Am_Object inter;
  int y;
  int x;
  Am_Object local_f0;
  Am_Value local_e8;
  Am_Value local_d8;
  Am_Object local_c8;
  Am_Object local_c0;
  Am_Value local_b8;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  undefined4 local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  Am_Value *local_50;
  Am_Object local_48;
  Am_Value local_40;
  
  pAVar1 = save_pos_for_undo.Call;
  local_64 = (undefined4)CONCAT71(in_register_00000031,vertical);
  local_60 = mousex;
  local_5c = mousey;
  Am_Object::Am_Object(&local_48,command);
  (*pAVar1)((Am_Object_Data *)&local_48);
  Am_Object::~Am_Object(&local_48);
  Am_Object::Get_Object(&local_a0,(Am_Slot_Key)command,10);
  bVar2 = Am_Object::Valid(&local_a0);
  if (!bVar2) goto LAB_0024b0e5;
  Am_Object::Get_Object(&local_f0,(Am_Slot_Key)&local_a0,10);
  bVar2 = Am_Object::Valid(&local_f0);
  if (bVar2) {
    local_a8.data = (Am_Object_Data *)0x0;
    pAVar4 = Am_Object::Get(&local_f0,0xc5,0);
    Am_Object::operator=(&local_a8,pAVar4);
    local_e8.type = 0;
    local_e8.value.wrapper_value = (Am_Wrapper *)0x0;
    local_b8.type = 0;
    local_b8.value.wrapper_value = (Am_Wrapper *)0x0;
    local_d8.type = 0;
    local_d8.value.wrapper_value = (Am_Wrapper *)0x0;
    pAVar4 = Am_Object::Get(&local_f0,0x181,1);
    local_50 = &local_b8;
    Am_Value::operator=(local_50,pAVar4);
    pAVar4 = Am_Object::Get(&local_f0,0x182,1);
    Am_Value::operator=(&local_d8,pAVar4);
    pAVar4 = Am_Object::Get(&local_f0,0x169,1);
    Am_Value::operator=(&local_e8,pAVar4);
    if ((local_b8.type == 2) && (local_d8.type == 2)) {
      lVar5 = Am_Value::operator_cast_to_long(&local_e8);
      val_1 = Am_Value::operator_cast_to_long(&local_b8);
      val_2 = Am_Value::operator_cast_to_long(&local_d8);
      target_val_1 = Am_Value::operator_cast_to_long(&local_b8);
      target_val_2 = Am_Value::operator_cast_to_long(&local_d8);
      lVar5 = Am_Clip_And_Map(lVar5,val_1,val_2,target_val_1,target_val_2);
      Am_Value::operator=(&local_e8,lVar5);
    }
    else {
      local_68 = Am_Value::operator_cast_to_float(&local_e8);
      local_6c = Am_Value::operator_cast_to_float(&local_b8);
      local_70 = Am_Value::operator_cast_to_float(&local_d8);
      local_74 = Am_Value::operator_cast_to_float(&local_b8);
      fVar6 = Am_Value::operator_cast_to_float(&local_d8);
      fVar6 = Am_Clip_And_Map(local_68,local_6c,local_70,local_74,fVar6);
      Am_Value::operator=(&local_e8,fVar6);
    }
    Am_Object::Set(&local_f0,0x169,&local_e8,0);
    Am_Object::Get_Object(&local_c0,(Am_Slot_Key)&local_f0,0x1b7);
    bVar2 = Am_Translate_Coordinates(ref_obj,local_60,local_5c,&local_f0,&local_54,&local_58);
    if (bVar2) {
      if ((char)local_64 == '\0') {
        pAVar4 = Am_Object::Get(&local_c0,100,0);
        iVar3 = Am_Value::operator_cast_to_int(pAVar4);
        if (iVar3 <= local_54) goto LAB_0024af70;
      }
      else {
        pAVar4 = Am_Object::Get(&local_c0,0x65,0);
        iVar3 = Am_Value::operator_cast_to_int(pAVar4);
        if (iVar3 <= local_58) goto LAB_0024af70;
      }
    }
    else {
LAB_0024af70:
      local_50 = &local_d8;
    }
    Am_Value::operator=(&local_e8,local_50);
    Am_Object::Am_Object(&local_80,&local_f0);
    Am_Get_Animator(&local_c8,(Am_Slot_Key)&local_80);
    Am_Object::~Am_Object(&local_80);
    pAVar4 = Am_Object::Get(&local_f0,0x184,0);
    Am_Object::Set(&local_c8,0x183,pAVar4,0);
    value = Am_Object::operator_cast_to_Am_Wrapper_(&local_a0);
    Am_Object::Set(&local_c8,0x1ac,value,0);
    Am_Object::Set(&local_f0,0x169,&local_e8,0x40000);
    Am_Value::Am_Value(&local_40,&local_e8);
    Am_Object::Am_Object(&local_88,&local_f0);
    Am_Object::Am_Object(&local_90,&local_a8);
    Am_Object::Am_Object(&local_98,command);
    set_scrollbar_and_commands(&local_40,&local_88,&local_90,&local_98,false);
    Am_Object::~Am_Object(&local_98);
    Am_Object::~Am_Object(&local_90);
    Am_Object::~Am_Object(&local_88);
    Am_Value::~Am_Value(&local_40);
    Am_Object::~Am_Object(&local_c8);
    Am_Object::~Am_Object(&local_c0);
    Am_Value::~Am_Value(&local_d8);
    Am_Value::~Am_Value(&local_b8);
    Am_Value::~Am_Value(&local_e8);
    Am_Object::~Am_Object(&local_a8);
  }
  Am_Object::~Am_Object(&local_f0);
LAB_0024b0e5:
  Am_Object::~Am_Object(&local_a0);
  return;
}

Assistant:

void
scroll_page_inter_command_start(Am_Object command, bool vertical,
                                Am_Object ref_obj, int mousex, int mousey)
{
  save_pos_for_undo.Call(command);

  Am_Object inter = command.Get_Owner();
  if (inter.Valid()) {
    Am_Object scrollbar = inter.Get_Owner();
    if (scrollbar.Valid()) {
      Am_Object scroll_command;
      scroll_command = scrollbar.Get(Am_COMMAND);

      Am_Value cur_value, val1, val2;
      val1 = scrollbar.Peek(Am_VALUE_1);
      val2 = scrollbar.Peek(Am_VALUE_2);
      cur_value = scrollbar.Peek(Am_VALUE);

      // clip cur_value inside val1 and val2
      if (val1.type == Am_INT && val2.type == Am_INT) {
        cur_value = Am_Clip_And_Map((long)cur_value, (long)val1, (long)val2,
                                    (long)val1, (long)val2);
      } else { // calc in float
        cur_value = Am_Clip_And_Map((float)cur_value, (float)val1, (float)val2,
                                    (float)val1, (float)val2);
      }
      scrollbar.Set(Am_VALUE, cur_value);

      // choose the appropriate target value,
      // based on whether click is above the indicator
      bool towards_val1 = false;
      Am_Object indicator = scrollbar.Get_Object(Am_SCROLL_INDICATOR);
      int indicator_pos, x, y;
      if (Am_Translate_Coordinates(ref_obj, mousex, mousey, scrollbar, x, y)) {
        if (vertical) {
          indicator_pos = indicator.Get(Am_TOP);
          if (indicator_pos > y)
            towards_val1 = true;
        } else { //horizontal
          indicator_pos = indicator.Get(Am_LEFT);
          if (indicator_pos > x)
            towards_val1 = true;
        }
      }
      if (towards_val1)
        cur_value = val1;
      else
        cur_value = val2;

      // set up the animation
      Am_Object animator = Am_Get_Animator(scrollbar, Am_VALUE);
      animator.Set(Am_SMALL_INCREMENT, scrollbar.Get(Am_LARGE_INCREMENT));
      animator.Set(Am_INTERACTOR, inter);

      // trigger the animation
      scrollbar.Set(Am_VALUE, cur_value, Am_WITH_ANIMATION);
      set_scrollbar_and_commands(cur_value, scrollbar, scroll_command, command,
                                 false);
    }
  }
}